

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor_tools.cpp
# Opt level: O0

void dlib::tt::scale_rows(tensor *out,tensor *m,tensor *v)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  size_t sVar4;
  size_t sVar5;
  ostream *poVar6;
  string *a;
  tensor *in_RDX;
  tensor *in_RSI;
  ostringstream dlib_o_out_3;
  ostringstream dlib_o_out_2;
  ostringstream dlib_o_out_1;
  ostringstream dlib_o_out;
  string *in_stack_fffffffffffff790;
  tensor *in_stack_fffffffffffff798;
  error_type eVar7;
  tensor *in_stack_fffffffffffff7a0;
  matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *in_stack_fffffffffffff7a8;
  ostringstream local_680 [72];
  matrix_exp<dlib::matrix_op<dlib::op_scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>,_dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_>_>_>
  *in_stack_fffffffffffff9c8;
  tensor *in_stack_fffffffffffff9d0;
  ostringstream local_4e0 [383];
  undefined1 local_361;
  ostringstream local_340 [383];
  undefined1 local_1c1;
  ostringstream local_190 [376];
  tensor *local_18;
  tensor *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = have_same_dimensions(in_stack_fffffffffffff7a0,in_stack_fffffffffffff798);
  if (!bVar1) {
    dlib_assert_breakpoint();
    eVar7 = (error_type)((ulong)in_stack_fffffffffffff798 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar2 = std::operator<<((ostream *)local_190,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x73);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_190,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_190,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::tt::scale_rows(tensor &, const tensor &, const tensor &)");
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_190,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"have_same_dimensions(out,m)");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_190,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    local_1c1 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff7a0,eVar7,in_stack_fffffffffffff790);
    local_1c1 = 0;
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  bVar1 = is_vector(in_stack_fffffffffffff7a0);
  if (!bVar1) {
    dlib_assert_breakpoint();
    eVar7 = (error_type)((ulong)in_stack_fffffffffffff798 >> 0x20);
    std::__cxx11::ostringstream::ostringstream(local_340);
    poVar2 = std::operator<<((ostream *)local_340,"\n\nError detected at line ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x74);
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_340,"Error detected in file ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                            );
    std::operator<<(poVar2,".\n");
    poVar2 = std::operator<<((ostream *)local_340,"Error detected in function ");
    poVar2 = std::operator<<(poVar2,
                             "void dlib::tt::scale_rows(tensor &, const tensor &, const tensor &)");
    std::operator<<(poVar2,".\n\n");
    poVar2 = std::operator<<((ostream *)local_340,"Failing expression was ");
    poVar2 = std::operator<<(poVar2,"is_vector(v)");
    std::operator<<(poVar2,".\n");
    poVar2 = (ostream *)std::ostream::operator<<(local_340,std::boolalpha);
    poVar2 = std::operator<<(poVar2,"");
    std::operator<<(poVar2,"\n");
    local_361 = 1;
    uVar3 = __cxa_allocate_exception(0x30);
    std::__cxx11::ostringstream::str();
    fatal_error::fatal_error
              ((fatal_error *)in_stack_fffffffffffff7a0,eVar7,in_stack_fffffffffffff790);
    local_361 = 0;
    __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
  }
  sVar4 = tensor::size(local_10);
  if ((sVar4 != 0) || (sVar4 = tensor::size(local_18), sVar4 != 0)) {
    sVar4 = tensor::size(local_10);
    if (sVar4 == 0) {
      dlib_assert_breakpoint();
      eVar7 = (error_type)((ulong)in_stack_fffffffffffff798 >> 0x20);
      std::__cxx11::ostringstream::ostringstream(local_4e0);
      poVar2 = std::operator<<((ostream *)local_4e0,"\n\nError detected at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x77);
      std::operator<<(poVar2,".\n");
      poVar2 = std::operator<<((ostream *)local_4e0,"Error detected in file ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                              );
      std::operator<<(poVar2,".\n");
      poVar2 = std::operator<<((ostream *)local_4e0,"Error detected in function ");
      poVar2 = std::operator<<(poVar2,
                               "void dlib::tt::scale_rows(tensor &, const tensor &, const tensor &)"
                              );
      std::operator<<(poVar2,".\n\n");
      poVar2 = std::operator<<((ostream *)local_4e0,"Failing expression was ");
      poVar2 = std::operator<<(poVar2,"m.size() != 0");
      std::operator<<(poVar2,".\n");
      poVar2 = (ostream *)std::ostream::operator<<(local_4e0,std::boolalpha);
      poVar2 = std::operator<<(poVar2,"");
      std::operator<<(poVar2,"\n");
      uVar3 = __cxa_allocate_exception(0x30);
      std::__cxx11::ostringstream::str();
      fatal_error::fatal_error
                ((fatal_error *)in_stack_fffffffffffff7a0,eVar7,in_stack_fffffffffffff790);
      __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
    }
    sVar4 = tensor::num_samples(local_10);
    sVar5 = tensor::size(local_18);
    if (sVar4 != sVar5) {
      dlib_assert_breakpoint();
      std::__cxx11::ostringstream::ostringstream(local_680);
      poVar2 = std::operator<<((ostream *)local_680,"\n\nError detected at line ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x78);
      std::operator<<(poVar2,".\n");
      poVar2 = std::operator<<((ostream *)local_680,"Error detected in file ");
      poVar2 = std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/arrufat[P]dlib-pytorch-benchmark/external/dlib/dlib/cuda/tensor_tools.cpp"
                              );
      std::operator<<(poVar2,".\n");
      poVar2 = std::operator<<((ostream *)local_680,"Error detected in function ");
      poVar2 = std::operator<<(poVar2,
                               "void dlib::tt::scale_rows(tensor &, const tensor &, const tensor &)"
                              );
      std::operator<<(poVar2,".\n\n");
      poVar2 = std::operator<<((ostream *)local_680,"Failing expression was ");
      poVar6 = std::operator<<(poVar2,"m.num_samples() == static_cast<long long>(v.size())");
      std::operator<<(poVar6,".\n");
      eVar7 = (error_type)((ulong)poVar6 >> 0x20);
      a = (string *)std::ostream::operator<<(local_680,std::boolalpha);
      poVar6 = std::operator<<((ostream *)a,"");
      std::operator<<(poVar6,"\n");
      uVar3 = __cxa_allocate_exception(0x30);
      std::__cxx11::ostringstream::str();
      fatal_error::fatal_error((fatal_error *)poVar2,eVar7,a);
      __cxa_throw(uVar3,&fatal_error::typeinfo,fatal_error::~fatal_error);
    }
    mat(in_stack_fffffffffffff798);
    mat(in_stack_fffffffffffff798);
    scale_rows<dlib::matrix_op<dlib::op_pointer_to_mat<float>>,dlib::matrix_op<dlib::op_pointer_to_mat<float>>>
              (in_stack_fffffffffffff7a8,
               (matrix_exp<dlib::matrix_op<dlib::op_pointer_to_mat<float>_>_> *)
               in_stack_fffffffffffff7a0);
    tensor::operator=(in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  }
  return;
}

Assistant:

void scale_rows (
        tensor& out,
        const tensor& m,
        const tensor& v
    )
    {
        DLIB_CASSERT(have_same_dimensions(out,m));
        DLIB_CASSERT(is_vector(v));
        if (m.size() == 0 && v.size() == 0)
            return;
        DLIB_CASSERT(m.size() != 0);
        DLIB_CASSERT(m.num_samples() == static_cast<long long>(v.size()));

#ifdef DLIB_USE_CUDA
        cuda::scale_rows(out, m, v);
#else
        out = scale_rows(mat(m), mat(v));
#endif
    }